

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_fma_any(flexfloat_t *dest,flexfloat_t *a,flexfloat_t *b,flexfloat_t *c)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  flexfloat_t *in_RCX;
  flexfloat_t *in_RDX;
  flexfloat_t *in_RSI;
  double *in_RDI;
  double dVar4;
  double try;
  fexcept_t flags;
  _Bool eff_sub;
  int mode;
  fexcept_t local_58;
  undefined1 local_55;
  int local_54;
  flexfloat_t *local_50;
  flexfloat_t *local_48;
  flexfloat_t *local_40;
  double *local_38;
  double local_30;
  double local_28;
  flexfloat_t *a_00;
  
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_54 = fegetround();
  _Var1 = flexfloat_sign(local_40);
  _Var2 = flexfloat_sign(local_48);
  _Var3 = flexfloat_sign(local_50);
  local_55 = (_Var1 != _Var2) != _Var3;
  if ((((((local_40->desc).frac_bits < 0x34) || ((local_48->desc).frac_bits < 0x34)) ||
       ((local_50->desc).frac_bits < 0x34)) || (*(byte *)((long)local_38 + 9) < 0x34)) &&
     (local_54 == 0)) {
    if ((bool)local_55) {
      fesetround(0xc00);
    }
    else {
      fegetexceptflag(&local_58,0x3d);
      dVar4 = fma(local_40->value,local_48->value,local_50->value);
      if (0.0 <= dVar4) {
        fesetround(0x800);
      }
      else {
        fesetround(0x400);
      }
      fesetexceptflag(&local_58,0x3d);
    }
  }
  a_00 = (flexfloat_t *)local_40->value;
  local_28 = local_48->value;
  local_30 = local_50->value;
  dVar4 = fma((double)a_00,local_28,local_30);
  *local_38 = dVar4;
  if (((local_40->desc).frac_bits < 0x34) && (local_54 == 0)) {
    fesetround(0);
  }
  flexfloat_sanitize(a_00);
  return;
}

Assistant:

INLINE void ff_fma_any(flexfloat_t *dest, const flexfloat_t *a, const flexfloat_t *b, const flexfloat_t *c) {
    #ifdef FLEXFLOAT_ROUNDING
    // Change the rounding mode according to the error direction if we need to do manual rounding for RNE
    int mode = fegetround();
    bool eff_sub = flexfloat_sign(a) ^ flexfloat_sign(b) ^ flexfloat_sign(c);
    if (((a->desc.frac_bits < NUM_BITS_FRAC) || (b->desc.frac_bits < NUM_BITS_FRAC)
         || (c->desc.frac_bits < NUM_BITS_FRAC) || (dest->desc.frac_bits < NUM_BITS_FRAC))
        && mode == FE_TONEAREST) {
        if (!eff_sub) { // in this case, we need to round away from zero
            fexcept_t flags;
            fegetexceptflag(&flags, FE_ALL_EXCEPT); // get accrued flags to not tarnish them here
            double try = fma(a->value, b->value, c->value);
            (try >= 0) ? fesetround(FE_UPWARD) : fesetround(FE_DOWNWARD);
            fesetexceptflag(&flags, FE_ALL_EXCEPT); // restore flags here
        } else {
            fesetround(FE_TOWARDZERO); // just truncate
        }
    }
    #endif
    dest->value = fma(a->value, b->value, c->value); // finally the actual operation
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = fma(a->exact_value, b->exact_value, c->exact_value);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    #ifdef FLEXFLOAT_ROUNDING
    if (a->desc.frac_bits < NUM_BITS_FRAC && mode == FE_TONEAREST)
        fesetround(FE_TONEAREST); // restore rounding
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->fma += 1;
    #endif
}